

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_hash.h
# Opt level: O3

size_t __thiscall
std::
hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofVarId>_>_>
::operator()(hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofVarId>_>_>
             *this,reference_wrapper<const_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofVarId>_>
                   x)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  
  piVar2 = ((x._M_data)->
           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumberofVarId>
           ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = ((x._M_data)->
           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumberofVarId>
           ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar3 = 0x9e3779b9;
  if (piVar2 != piVar1) {
    uVar3 = 0;
    do {
      uVar3 = uVar3 * 0x40 + 0x9e3779b9 + (uVar3 >> 2) + (long)*piVar2 ^ uVar3;
      piVar2 = piVar2 + 1;
    } while (piVar2 != piVar1);
    uVar3 = uVar3 + 0x9e3779b9;
  }
  return uVar3 * 0x40 + 0x9e3779b9 + (uVar3 >> 2) ^ uVar3;
}

Assistant:

size_t operator()( std::reference_wrapper<
        const mp::CustomFunctionalConstraint
          <Args, Params, NumOrLogic, Id> > x) const
  {
    mp::HashStreamer hs;
    hs.Add(std::hash<Args>{}(x.get().GetArguments()));
    hs.Add(std::hash<Params>{}(x.get().GetParameters()));
    return hs.FinalizeHashValue();
  }